

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O0

list_conflict forward2(list_conflict t,int n)

{
  group_conflict g_00;
  group pgVar1;
  int local_84c;
  int pos;
  group_conflict g2;
  group_conflict g;
  character used2 [257];
  int local_428 [2];
  character used1 [257];
  int n_local;
  list_conflict t_local;
  
  local_84c = 0;
  t_local = t;
  if (1 < n) {
    initmem(groupmem,0x30,n / 0xf);
    initmem(bucketmem,0x28,n / 5);
    g_00 = (group_conflict)allocmem(groupmem,0x30);
    pgVar1 = (group)allocmem(groupmem,0x30);
    g_00->nextunf = pgVar1;
    g_00->next = pgVar1;
    pgVar1->head = t;
    pgVar1->nextunf = (group)0x0;
    pgVar1->next = (group)0x0;
    pgVar1->finis = 0;
    intobuckets(g_00,forward2::b,local_428,(int *)&g,0);
    while (g_00->nextunf != (group)0x0) {
      local_84c = local_84c + 2;
      intogroups(forward2::b,local_428,(int *)&g,local_84c);
      intobuckets(g_00,forward2::b,local_428,(int *)&g,local_84c);
    }
    t_local = collect(g_00);
    freemem(bucketmem);
    freemem(groupmem);
  }
  return t_local;
}

Assistant:

static inline list forward2(list t, int n)
{
   static bucket b[BUCKETS]; /* buckets */
   character used1[CHARS+1]; /* What buckets are used? The number of */
   character used2[CHARS+1]; /* buckets is stored in the last element */
   group g, g2;              /* groups */
   int pos = 0;              /* pos in string */

   if (n<2) return t;

   initmem(groupmem, sizeof(struct grouprec), n/15);
   initmem(bucketmem, sizeof(struct bucketrec), n/5);

   g = (group) allocmem(groupmem, sizeof(struct grouprec));
   g2 = (group) allocmem(groupmem, sizeof(struct grouprec));
   g->next = g->nextunf = g2;
   g2->head = t;
   g2->next = g2->nextunf = NULL; 
   g2->finis = FALSE;

   intobuckets(g, b, used1, used2, pos);
   while (g->nextunf) {
      pos += 2;
      intogroups(b, used1, used2, pos);
      intobuckets(g, b, used1, used2, pos);
   }
   t = collect(g);

   freemem(bucketmem);
   freemem(groupmem);

   return t;
}